

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeClose(Btree *p)

{
  int iVar1;
  BtShared *pBt;
  BtCursor *pBVar2;
  Btree *pBVar3;
  Btree *pBVar4;
  bool bVar5;
  BtShared *pBVar6;
  int extraout_EAX;
  sqlite3_mutex *psVar7;
  BtShared **ppBVar8;
  BtShared *pBVar9;
  BtCursor *pCur;
  
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  pBVar2 = pBt->pCursor;
  while (pCur = pBVar2, pCur != (BtCursor *)0x0) {
    pBVar2 = pCur->pNext;
    if (pCur->pBtree == p) {
      sqlite3BtreeCloseCursor(pCur);
    }
  }
  sqlite3BtreeRollback(p,0,0);
  sqlite3BtreeLeave(p);
  if (p->sharable != '\0') {
    bVar5 = true;
    if (sqlite3Config.bCoreMutex == 0) {
LAB_001439ec:
      psVar7 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar7 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      if (psVar7 == (sqlite3_mutex *)0x0) goto LAB_001439ec;
      (*sqlite3Config.mutex.xMutexEnter)(psVar7);
      bVar5 = false;
    }
    iVar1 = pBt->nRef;
    pBt->nRef = iVar1 + -1;
    if (iVar1 < 2) {
      pBVar6 = sqlite3SharedCacheList;
      if (sqlite3SharedCacheList == pBt) {
        ppBVar8 = &sqlite3SharedCacheList;
      }
      else {
        do {
          pBVar9 = pBVar6;
          if (pBVar9 == (BtShared *)0x0) goto LAB_00143a33;
          pBVar6 = pBVar9->pNext;
        } while (pBVar9->pNext != pBt);
        ppBVar8 = &pBVar9->pNext;
      }
      *ppBVar8 = pBt->pNext;
LAB_00143a33:
      if (pBt->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)(pBt->mutex);
      }
    }
    if (!bVar5) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar7);
    }
    if (1 < iVar1) goto LAB_00143a90;
  }
  sqlite3PagerClose(pBt->pPager,p->db);
  if ((pBt->xFreeSchema != (_func_void_void_ptr *)0x0) && (pBt->pSchema != (void *)0x0)) {
    (*pBt->xFreeSchema)(pBt->pSchema);
  }
  sqlite3DbFree((sqlite3 *)0x0,pBt->pSchema);
  freeTempSpace(pBt);
  sqlite3_free(pBt);
LAB_00143a90:
  pBVar3 = p->pNext;
  pBVar4 = p->pPrev;
  if (pBVar4 != (Btree *)0x0) {
    pBVar4->pNext = pBVar3;
  }
  if (pBVar3 != (Btree *)0x0) {
    pBVar3->pPrev = pBVar4;
  }
  sqlite3_free(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClose(Btree *p){
  BtShared *pBt = p->pBt;
  BtCursor *pCur;

  /* Close all cursors opened via this handle.  */
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  pCur = pBt->pCursor;
  while( pCur ){
    BtCursor *pTmp = pCur;
    pCur = pCur->pNext;
    if( pTmp->pBtree==p ){
      sqlite3BtreeCloseCursor(pTmp);
    }
  }

  /* Rollback any active transaction and free the handle structure.
  ** The call to sqlite3BtreeRollback() drops any table-locks held by
  ** this handle.
  */
  sqlite3BtreeRollback(p, SQLITE_OK, 0);
  sqlite3BtreeLeave(p);

  /* If there are still other outstanding references to the shared-btree
  ** structure, return now. The remainder of this procedure cleans 
  ** up the shared-btree.
  */
  assert( p->wantToLock==0 && p->locked==0 );
  if( !p->sharable || removeFromSharingList(pBt) ){
    /* The pBt is no longer on the sharing list, so we can access
    ** it without having to hold the mutex.
    **
    ** Clean out and delete the BtShared object.
    */
    assert( !pBt->pCursor );
    sqlite3PagerClose(pBt->pPager, p->db);
    if( pBt->xFreeSchema && pBt->pSchema ){
      pBt->xFreeSchema(pBt->pSchema);
    }
    sqlite3DbFree(0, pBt->pSchema);
    freeTempSpace(pBt);
    sqlite3_free(pBt);
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  assert( p->wantToLock==0 );
  assert( p->locked==0 );
  if( p->pPrev ) p->pPrev->pNext = p->pNext;
  if( p->pNext ) p->pNext->pPrev = p->pPrev;
#endif

  sqlite3_free(p);
  return SQLITE_OK;
}